

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

void __thiscall
ctemplate::SectionTemplateNode::SectionTemplateNode
          (SectionTemplateNode *this,TemplateToken *token,bool hidden_by_default)

{
  allocator local_21;
  
  (this->super_TemplateNode)._vptr_TemplateNode = (_func_int **)&PTR__SectionTemplateNode_00153198;
  TemplateToken::TemplateToken(&this->token_,token);
  anon_unknown_14::HashedTemplateString::HashedTemplateString
            (&this->variable_,(this->token_).text,(this->token_).textlen);
  (this->node_list_).
  super__List_base<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->node_list_;
  (this->node_list_).
  super__List_base<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->node_list_;
  (this->node_list_).
  super__List_base<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>._M_impl.
  _M_node._M_size = 0;
  this->separator_section_ = (SectionTemplateNode *)0x0;
  std::__cxx11::string::string((string *)&this->indentation_,"\n",&local_21);
  this->hidden_by_default_ = hidden_by_default;
  return;
}

Assistant:

SectionTemplateNode::SectionTemplateNode(const TemplateToken& token,
                                         bool hidden_by_default)

    : token_(token),
      variable_(token_.text, token_.textlen),
      separator_section_(NULL), indentation_("\n"),
      hidden_by_default_(hidden_by_default) {
  VLOG(2) << "Constructing SectionTemplateNode: "
          << string(token_.text, token_.textlen) << endl;
}